

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.c
# Opt level: O3

record * push_front(cache *Cache,char *label)

{
  int iVar1;
  size_t sVar2;
  void *pvVar3;
  hashnode *phVar4;
  record *prVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  record *prVar10;
  int iVar11;
  bool bVar12;
  _Bool is_find;
  _Bool local_39;
  char *local_38;
  
  local_39 = false;
  uVar6 = Cache->length;
  local_38 = label;
  if (Cache->max_length - 1 <= uVar6) {
    iVar9 = -10;
    uVar7 = uVar6;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        prVar5 = Cache->records;
        uVar8 = Cache->last;
        uVar6 = (ulong)(int)uVar8;
        iVar11 = prVar5[uVar6].last;
        prVar5[uVar6].valid = false;
        if ((-1 < (long)uVar6) && (uVar6 < Cache->max_length)) {
          iVar1 = Cache->stack_top;
          Cache->stack_top = iVar1 + 1;
          Cache->stack[(long)iVar1 + 1] = uVar8;
          uVar6 = (ulong)Cache->last;
        }
        pvVar3 = (*Cache->get_label)(prVar5 + uVar6);
        reset_hash_node(&Cache->label_hash,pvVar3);
        Cache->used_size = Cache->used_size - (long)Cache->records[Cache->last].size;
        (*Cache->realse)(Cache->records + Cache->last);
        Cache->records[iVar11].next = -1;
        Cache->last = iVar11;
        sVar2 = Cache->length;
        uVar6 = sVar2 - 1;
        Cache->length = uVar6;
        if (sVar2 == 2) {
          uVar7 = 1;
        }
        else {
          uVar7 = uVar6;
          if (sVar2 != 1) goto LAB_00102ed2;
          Cache->last = 0;
          iVar11 = 0;
          uVar7 = 0;
        }
        Cache->first = iVar11;
      }
LAB_00102ed2:
      iVar9 = iVar9 + 1;
    } while (iVar9 != 0);
  }
  if (Cache->max_size < Cache->used_size + 0x400) {
    iVar9 = 9;
    uVar7 = uVar6;
    do {
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        prVar5 = Cache->records;
        uVar8 = Cache->last;
        uVar6 = (ulong)(int)uVar8;
        iVar11 = prVar5[uVar6].last;
        prVar5[uVar6].valid = false;
        if ((-1 < (long)uVar6) && (uVar6 < Cache->max_length)) {
          iVar1 = Cache->stack_top;
          Cache->stack_top = iVar1 + 1;
          Cache->stack[(long)iVar1 + 1] = uVar8;
          uVar6 = (ulong)Cache->last;
        }
        pvVar3 = (*Cache->get_label)(prVar5 + uVar6);
        reset_hash_node(&Cache->label_hash,pvVar3);
        Cache->used_size = Cache->used_size - (long)Cache->records[Cache->last].size;
        (*Cache->realse)(Cache->records + Cache->last);
        Cache->records[iVar11].next = -1;
        Cache->last = iVar11;
        sVar2 = Cache->length;
        uVar6 = sVar2 - 1;
        Cache->length = uVar6;
        if (sVar2 == 2) {
          uVar7 = 1;
        }
        else {
          uVar7 = uVar6;
          if (sVar2 != 1) goto LAB_00102fbe;
          Cache->last = 0;
          iVar11 = 0;
          uVar7 = 0;
        }
        Cache->first = iVar11;
      }
LAB_00102fbe:
      bVar12 = iVar9 != 0;
      iVar9 = iVar9 + -1;
    } while ((bVar12) || (iVar9 = 9, uVar7 = uVar6, Cache->max_size < Cache->used_size + 0x400));
  }
  phVar4 = set_hashnode(&Cache->label_hash,local_38,(void *)0x0,&local_39);
  if (local_39 == true) {
    prVar5 = (record *)phVar4->record;
    prVar10 = Cache->records;
    if ((long)prVar5 - (long)prVar10 < 1) {
      uVar8 = 0xffffffff;
    }
    else {
      uVar6 = ((ulong)((long)prVar5 - (long)prVar10) >> 3) * -0x5555555555555555;
      uVar8 = 0xffffffff;
      if (uVar6 < Cache->max_length || uVar6 - Cache->max_length == 0) {
        uVar8 = (uint)uVar6;
      }
    }
    if (uVar8 == Cache->first) {
      return prVar5;
    }
    iVar9 = prVar5->last;
    if (prVar5->next < 1) {
      Cache->last = iVar9;
      prVar10[iVar9].next = -1;
    }
    else {
      prVar10[iVar9].next = prVar5->next;
      prVar10[prVar5->next].last = iVar9;
    }
    uVar6 = Cache->length;
LAB_001030bf:
    if (uVar6 < 2) {
      prVar5->next = -1;
      prVar5->last = 0;
      prVar10->next = uVar8;
      Cache->last = uVar8;
    }
    else {
      iVar9 = Cache->first;
      prVar5->next = iVar9;
      prVar5->last = 0;
      prVar10[iVar9].last = uVar8;
      prVar10->next = uVar8;
    }
    Cache->first = uVar8;
    return prVar5;
  }
  iVar9 = Cache->stack_top;
  if (0 < (long)iVar9) {
    Cache->stack_top = iVar9 + -1;
    uVar8 = Cache->stack[iVar9];
    if (-1 < (long)(int)uVar8) {
      prVar10 = Cache->records;
      prVar5 = prVar10 + (int)uVar8;
      phVar4->record = prVar5;
      prVar5->valid = true;
      prVar5->size = 0;
      uVar6 = Cache->length + 1;
      Cache->length = uVar6;
      goto LAB_001030bf;
    }
  }
  printf("no remain space");
  exit(1);
}

Assistant:

static inline struct record* push_front(cache*Cache,const char *label) {
  //向头插入
  bool is_find=false;
  hashnode *node;
  struct record *operate_record;
  // struct record_data* operate_record_data;
  int operate_record_addr;
  // time_t now = time(NULL);
  
  // if (now >= ttl){
  //   return -1;
  // }
  if (is_full(Cache)) {
    pop_back(Cache);
    #ifdef LOG_INCLUDED
    log_debug("pop back done\n");
    #endif
  }

  while (Cache->used_size + 1024 > Cache->max_size) {//预分配1kB内存，可能会超出范围
    pop_back(Cache);
    #ifdef LOG_INCLUDED
    log_debug("pop back done\n");
    #endif
  }
  node = set_hashnode(&Cache->label_hash,(void*)label,NULL,&is_find);//暂时用NULL占位

  if (is_find) { //找到了,但是也需要把它拉到最前面去
    operate_record = node->record;
    operate_record_addr = get_record_addr(Cache,operate_record);
    // operate_record_data = &operate_record->data;
    // //找到最后一个元素，并分配一个空间
    // while(operate_record_data->next){
    //   operate_record_data = operate_record_data->next;
    // }
    // operate_record_data =  operate_record_data->next = (struct record_data*)malloc(sizeof(struct record_data));
    
    //如果本来就是第一个，后面就不需要做了
    if (operate_record_addr == Cache->first) {
      // memcpy(&operate_record_data->ip, ip, sizeof(struct IP));
      return operate_record;
    }
    //否则就要把节点先切出来
    linklist_remove_node(Cache, operate_record);
  } else {
    //需要新分配一个空间
    if ((operate_record_addr = cache_stack_pop(Cache)) < 0) {
      printf("no remain space");
      exit(EXIT_FAILURE);
    }
    node->record = &Cache->records[operate_record_addr];
    operate_record = &Cache->records[operate_record_addr];
    // operate_record_data = &operate_record->data;
    operate_record_addr = operate_record_addr;
    // strcpy_s(operate_record->label,sizeof(operate_record->label),label);
    operate_record->valid = 1;
    operate_record->size = 0;
    Cache->length++;
    // Cache->used_size += record_size;
  }
  // memcpy(&operate_record->data.ip, ip, sizeof(struct IP));
  // operate_record->data.next=NULL;
  // operate_record->data.ttl = ttl;
  // operate_record->record_data_length++;

  if (Cache->length > 1) {
    operate_record->next = Cache->first;
    operate_record->last = LRU_BUFFER_HEAD_POINT;
    Cache->first = Cache->records[LRU_BUFFER_HEAD_POINT].next =
        Cache->records[Cache->first].last = operate_record_addr;
  } else {
    //只有新插入节点一个节点
    operate_record->next = -1;
    operate_record->last = LRU_BUFFER_HEAD_POINT;
    Cache->first = Cache->last = Cache->records[LRU_BUFFER_HEAD_POINT].next =
        operate_record_addr;
  }
  return operate_record;
}